

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanUnitStringPhase2(string *unit_string)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __const_iterator __first;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  iterator this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type dpos;
  size_type len;
  bool changed;
  string *in_stack_000000b0;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  __const_iterator in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar7;
  char *local_20;
  
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          length(in_RDI);
  bVar1 = bracketModifiers(in_stack_000000b0);
  local_20 = (char *)CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                     find_first_of(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,0x6c7f34);
  while (local_20 != (char *)0xffffffffffffffff) {
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(in_RDI);
    in_stack_ffffffffffffff98._M_current = local_20;
    if (((local_20 < (char *)(sVar3 - 1)) &&
        (pvVar4 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                            (in_stack_ffffffffffffff80,
                             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
        in_stack_ffffffffffffff98._M_current = local_20, '/' < *pvVar4)) &&
       (pvVar4 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_ffffffffffffff80,
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78)),
       in_stack_ffffffffffffff98._M_current = local_20, *pvVar4 < ':')) {
      pcVar5 = (char *)CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       find_first_of(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,0x6c7fc4);
      in_stack_ffffffffffffff98._M_current = local_20;
      local_20 = pcVar5;
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80);
      local_20 = (char *)CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         find_first_of(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f,0x6c7ffe)
      ;
    }
  }
  this_00 = in_RDI;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this_00)
  ;
  uVar7 = 0x2b;
  __last._M_current._7_1_ = in_stack_ffffffffffffff97;
  __last._M_current._0_7_ = in_stack_ffffffffffffff90;
  std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (in_stack_ffffffffffffff98,__last,(char *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  this = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  __first._M_current._7_1_ = uVar7;
  __first._M_current._0_7_ = in_stack_ffffffffffffffb8;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_current,
             __first,in_stack_ffffffffffffffb0);
  clearEmptySegments((string *)in_stack_ffffffffffffffb0._M_current);
  bVar6 = true;
  if (!bVar1) {
    sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            length(in_RDI);
    bVar6 = sVar2 != sVar3;
  }
  return bVar6;
}

Assistant:

static bool cleanUnitStringPhase2(std::string& unit_string)
{
    bool changed{false};
    auto len = unit_string.length();

    if (bracketModifiers(unit_string)) {
        changed = true;
    }

    // cleanup extraneous dashes
    auto dpos = unit_string.find_first_of('-');
    while (dpos != std::string::npos) {
        if (dpos < unit_string.size() - 1) {
            if (unit_string[dpos + 1] >= '0' && unit_string[dpos + 1] <= '9') {
                dpos = unit_string.find_first_of('-', dpos + 1);
                continue;
            }
        }

        unit_string.erase(dpos, 1);
        dpos = unit_string.find_first_of('-', dpos);
    }
    unit_string.erase(
        std::remove(unit_string.begin(), unit_string.end(), '+'),
        unit_string.end());

    clearEmptySegments(unit_string);

    return changed || (len != unit_string.length());
}